

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

mat33 * nifti_mat33_inverse(mat33 R)

{
  float fVar1;
  mat33 *in_RDI;
  float in_stack_00000008;
  float in_stack_0000000c;
  double deti;
  double r33;
  double r32;
  double r31;
  double r23;
  double r22;
  double r21;
  double r13;
  double r12;
  double r11;
  
  fVar1 = (R.m[1][1] * in_stack_0000000c * R.m[1][0] +
          R.m[0][1] * R.m[1][2] * R.m[0][0] +
          ((in_stack_00000008 * R.m[0][2] * R.m[2][0] - in_stack_00000008 * R.m[1][2] * R.m[1][0]) -
          R.m[0][1] * in_stack_0000000c * R.m[2][0])) - R.m[1][1] * R.m[0][2] * R.m[0][0];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar1 = 1.0 / fVar1;
  }
  in_RDI->m[0][0] = fVar1 * (R.m[0][2] * R.m[2][0] + -(R.m[1][2] * R.m[1][0]));
  in_RDI->m[0][1] = fVar1 * (-in_stack_0000000c * R.m[2][0] + R.m[1][2] * R.m[0][0]);
  in_RDI->m[0][2] = fVar1 * (in_stack_0000000c * R.m[1][0] + -(R.m[0][2] * R.m[0][0]));
  in_RDI->m[1][0] = fVar1 * (-R.m[0][1] * R.m[2][0] + R.m[1][1] * R.m[1][0]);
  in_RDI->m[1][1] = fVar1 * (in_stack_00000008 * R.m[2][0] + -(R.m[1][1] * R.m[0][0]));
  in_RDI->m[1][2] = fVar1 * (-in_stack_00000008 * R.m[1][0] + R.m[0][1] * R.m[0][0]);
  in_RDI->m[2][0] = fVar1 * (R.m[0][1] * R.m[1][2] + -(R.m[1][1] * R.m[0][2]));
  in_RDI->m[2][1] = fVar1 * (-in_stack_00000008 * R.m[1][2] + R.m[1][1] * in_stack_0000000c);
  in_RDI->m[2][2] = fVar1 * (in_stack_00000008 * R.m[0][2] + -(R.m[0][1] * in_stack_0000000c));
  return in_RDI;
}

Assistant:

mat33 nifti_mat33_inverse( mat33 R )   /* inverse of 3x3 matrix */
{
   double r11,r12,r13,r21,r22,r23,r31,r32,r33 , deti ;
   mat33 Q ;
                                                       /*  INPUT MATRIX:  */
   r11 = R.m[0][0]; r12 = R.m[0][1]; r13 = R.m[0][2];  /* [ r11 r12 r13 ] */
   r21 = R.m[1][0]; r22 = R.m[1][1]; r23 = R.m[1][2];  /* [ r21 r22 r23 ] */
   r31 = R.m[2][0]; r32 = R.m[2][1]; r33 = R.m[2][2];  /* [ r31 r32 r33 ] */

   deti = r11*r22*r33-r11*r32*r23-r21*r12*r33
         +r21*r32*r13+r31*r12*r23-r31*r22*r13 ;

   if( deti != 0.0l ) deti = 1.0l / deti ;

   Q.m[0][0] = (float)( deti*( r22*r33-r32*r23) ) ;
   Q.m[0][1] = (float)( deti*(-r12*r33+r32*r13) ) ;
   Q.m[0][2] = (float)( deti*( r12*r23-r22*r13) ) ;

   Q.m[1][0] = (float)( deti*(-r21*r33+r31*r23) ) ;
   Q.m[1][1] = (float)( deti*( r11*r33-r31*r13) ) ;
   Q.m[1][2] = (float)( deti*(-r11*r23+r21*r13) ) ;

   Q.m[2][0] = (float)( deti*( r21*r32-r31*r22) ) ;
   Q.m[2][1] = (float)( deti*(-r11*r32+r31*r12) ) ;
   Q.m[2][2] = (float)( deti*( r11*r22-r21*r12) ) ;

   return Q ;
}